

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void concept_suite::input_iterator_dereferenceable(void)

{
  reference piVar1;
  initializer_list<int> __l;
  undefined4 local_64;
  iterator a;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = (pointer)0x160000000b;
  span.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&a);
  span.member.data = (pointer)0x0;
  if ((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.member.data =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
  }
  span.member.cap =
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  span.member.size = span.member.cap;
  span.member.next = span.member.cap;
  a = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*(&a);
  local_64 = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("*a","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x6b,"void concept_suite::input_iterator_dereferenceable()",piVar1,&local_64);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void input_iterator_dereferenceable()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.begin();
    BOOST_TEST_EQ(*a, 11);
}